

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_reduce(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  JSValue JVar1;
  JSValue new_target;
  JSValueUnion JVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int64_t iVar7;
  long lVar8;
  ulong uVar9;
  JSValueUnion JVar10;
  ulong idx;
  long lVar11;
  int64_t iVar12;
  ulong uVar13;
  bool bVar14;
  JSValue obj;
  JSValue obj_00;
  JSValue obj_01;
  JSValue func_obj;
  JSValue v;
  JSValue obj_02;
  JSValue v_00;
  JSValue JVar15;
  JSValue JVar16;
  int64_t len;
  JSValueUnion local_d8;
  JSValueUnion local_c8;
  int64_t iStack_c0;
  JSValueUnion local_b8;
  int64_t iStack_b0;
  uint local_a4;
  int64_t local_a0;
  JSValueUnion local_98;
  int64_t local_90;
  long local_88;
  JSValueUnion local_80;
  JSValueUnion local_78;
  int64_t iStack_70;
  JSValueUnion local_68;
  int64_t iStack_60;
  double local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  int64_t iVar6;
  
  JVar10 = this_val.u;
  local_c8.ptr = (void *)(local_c8 << 0x20);
  iStack_c0 = 3;
  local_b8.ptr = (void *)(local_b8 << 0x20);
  iStack_b0 = 3;
  local_a4 = special;
  if ((special & 8U) == 0) {
    this_val = JS_ToObject(ctx,this_val);
    iVar3 = js_get_length64(ctx,&local_88,this_val);
    JVar16 = this_val;
    if (iVar3 == 0) {
LAB_00164d85:
      iVar7 = this_val.tag;
      local_98 = this_val.u;
      JVar10 = (JSValueUnion)(argv->u).ptr;
      iVar12 = argv->tag;
      iVar3 = check_function(ctx,*argv);
      JVar2 = local_98;
      if (iVar3 == 0) {
        local_a0 = iVar12;
        local_80 = JVar10;
        if (argc < 2) {
          lVar8 = 0;
          if (0 < local_88) {
            lVar8 = local_88;
          }
          JVar16.tag = iVar7;
          JVar16.u.ptr = local_98.ptr;
          JVar1.tag = iVar7;
          JVar1.u.ptr = local_98.ptr;
          lVar5 = 0;
          lVar11 = local_88;
          do {
            lVar4 = lVar5;
            lVar11 = lVar11 + -1;
            if (lVar8 == lVar4) {
              JS_ThrowTypeError(ctx,"empty array");
              goto LAB_00164db7;
            }
            lVar5 = lVar11;
            if ((local_a4 & 1) == 0) {
              lVar5 = lVar4;
            }
            if ((local_a4 & 8) != 0) {
              obj_00.tag = iVar7;
              obj_00.u.ptr = JVar2.ptr;
              _local_c8 = JS_GetPropertyInt64(ctx,obj_00,lVar5);
              JVar16 = JVar1;
              if (local_c8._8_4_ == 6) goto LAB_00164db7;
              break;
            }
            obj.tag = iVar7;
            obj.u.ptr = JVar2.ptr;
            iVar3 = JS_TryGetPropertyInt64(ctx,obj,lVar5,(JSValue *)&local_c8);
            if (iVar3 < 0) goto LAB_0016514e;
            lVar5 = lVar4 + 1;
          } while (iVar3 == 0);
          uVar13 = lVar4 + 1;
        }
        else {
          local_78 = argv[1].u;
          _local_c8 = *(JSValue *)&argv[1].u;
          if (0xfffffff4 < (uint)argv[1].tag) {
            *(int *)local_78.ptr = *local_78.ptr + 1;
          }
          uVar13 = 0;
        }
        if ((long)uVar13 < local_88) {
          local_90 = iStack_c0;
          uVar9 = ~uVar13 + local_88;
          iVar12 = local_a0;
          do {
            idx = uVar9;
            if ((local_a4 & 1) == 0) {
              idx = uVar13;
            }
            if ((local_a4 & 8) == 0) {
              obj_02.tag = iVar7;
              obj_02.u.ptr = JVar2.ptr;
              iVar3 = JS_TryGetPropertyInt64(ctx,obj_02,idx,(JSValue *)&local_b8);
              if (iVar3 < 0) goto LAB_0016514e;
            }
            else {
              obj_01.tag = iVar7;
              obj_01.u.ptr = JVar2.ptr;
              _local_b8 = JS_GetPropertyInt64(ctx,obj_01,idx);
              iVar3 = 1;
              if (local_b8._8_4_ == 6) goto LAB_0016514e;
            }
            JVar16 = _local_c8;
            iVar6 = local_90;
            if (iVar3 != 0) {
              bVar14 = (long)(int)idx == idx;
              local_58 = (double)(long)idx;
              if (bVar14) {
                local_58 = (double)(idx & 0xffffffff);
              }
              local_50 = 7;
              if (bVar14) {
                local_50 = 0;
              }
              local_78 = local_c8;
              iStack_70 = iStack_c0;
              local_68 = local_b8;
              iStack_60 = iStack_b0;
              local_48.float64 = JVar2.float64;
              local_d8.float64 = local_d8.float64 & 0xffffffff00000000;
              new_target.tag = 3;
              new_target.u.ptr = local_d8.ptr;
              func_obj.tag = iVar12;
              func_obj.u.float64 = local_80.float64;
              local_40 = iVar7;
              JVar16 = JS_CallInternal(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),new_target,4,
                                       (JSValue *)&local_78,2);
              iVar6 = JVar16.tag;
              if ((0xfffffff4 < local_b8._8_4_) &&
                 (iVar3 = *local_b8.ptr, *(int *)local_b8.ptr = iVar3 + -1, iVar3 < 2)) {
                __JS_FreeValueRT(ctx->rt,_local_b8);
              }
              local_b8.ptr = (void *)(local_b8 << 0x20);
              iStack_b0 = 3;
              if ((int)JVar16.tag == 6) goto LAB_0016514e;
              local_d8.float64 = local_c8.float64;
              iVar12 = local_a0;
              if ((0xfffffff4 < (uint)local_90) &&
                 (iVar3 = *local_c8.ptr, *(int *)local_c8.ptr = iVar3 + -1, iVar3 < 2)) {
                v.tag = local_90;
                v.u.ptr = local_c8.ptr;
                __JS_FreeValueRT(ctx->rt,v);
                iVar12 = local_a0;
              }
            }
            local_90 = iVar6;
            _local_c8 = JVar16;
            uVar13 = uVar13 + 1;
            bVar14 = uVar9 != 0;
            uVar9 = uVar9 - 1;
          } while (bVar14);
        }
        if ((0xfffffff4 < (uint)this_val.tag) &&
           (iVar3 = *JVar2.ptr, *(int *)JVar2.ptr = iVar3 + -1, iVar3 < 2)) {
          v_00.tag = iVar7;
          v_00.u.ptr = JVar2.ptr;
          __JS_FreeValueRT(ctx->rt,v_00);
        }
        goto LAB_00164e54;
      }
      JVar16.tag = iVar7;
      JVar16.u.ptr = local_98.ptr;
    }
  }
  else {
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)JVar10.ptr = *JVar10.ptr + 1;
    }
    local_78 = JVar10;
    iVar3 = js_typed_array_get_length_internal(ctx,this_val);
    local_88 = (long)iVar3;
    JVar16 = this_val;
    if (-1 < iVar3) goto LAB_00164d85;
  }
  goto LAB_00164db7;
LAB_0016514e:
  JVar16.tag = iVar7;
  JVar16.u.ptr = JVar2.ptr;
LAB_00164db7:
  if ((0xfffffff4 < local_c8._8_4_) &&
     (iVar3 = *local_c8.ptr, *(int *)local_c8.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,_local_c8);
  }
  if ((0xfffffff4 < local_b8._8_4_) &&
     (iVar3 = *local_b8.ptr, *(int *)local_b8.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,_local_b8);
  }
  if ((0xfffffff4 < (uint)JVar16.tag) &&
     (iVar3 = *JVar16.u.ptr, *(int *)JVar16.u.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar16);
  }
  iStack_c0 = 6;
  local_c8.float64 = 0.0;
LAB_00164e54:
  JVar15.tag = iStack_c0;
  JVar15.u.float64 = local_c8.float64;
  return JVar15;
}

Assistant:

static JSValue js_array_reduce(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int special)
{
    JSValue obj, val, index_val, acc, acc1;
    JSValueConst args[4];
    JSValueConst func;
    int64_t len, k, k1;
    int present;

    acc = JS_UNDEFINED;
    val = JS_UNDEFINED;
    if (special & special_TA) {
        obj = JS_DupValue(ctx, this_val);
        len = js_typed_array_get_length_internal(ctx, obj);
        if (len < 0)
            goto exception;
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (js_get_length64(ctx, &len, obj))
            goto exception;
    }
    func = argv[0];

    if (check_function(ctx, func))
        goto exception;

    k = 0;
    if (argc > 1) {
        acc = JS_DupValue(ctx, argv[1]);
    } else {
        for(;;) {
            if (k >= len) {
                JS_ThrowTypeError(ctx, "empty array");
                goto exception;
            }
            k1 = (special & special_reduceRight) ? len - k - 1 : k;
            k++;
            if (special & special_TA) {
                acc = JS_GetPropertyInt64(ctx, obj, k1);
                if (JS_IsException(acc))
                    goto exception;
                break;
            } else {
                present = JS_TryGetPropertyInt64(ctx, obj, k1, &acc);
                if (present < 0)
                    goto exception;
                if (present)
                    break;
            }
        }
    }
    for (; k < len; k++) {
        k1 = (special & special_reduceRight) ? len - k - 1 : k;
        if (special & special_TA) {
            val = JS_GetPropertyInt64(ctx, obj, k1);
            if (JS_IsException(val))
                goto exception;
            present = TRUE;
        } else {
            present = JS_TryGetPropertyInt64(ctx, obj, k1, &val);
            if (present < 0)
                goto exception;
        }
        if (present) {
            index_val = JS_NewInt64(ctx, k1);
            if (JS_IsException(index_val))
                goto exception;
            args[0] = acc;
            args[1] = val;
            args[2] = index_val;
            args[3] = obj;
            acc1 = JS_Call(ctx, func, JS_UNDEFINED, 4, args);
            JS_FreeValue(ctx, index_val);
            JS_FreeValue(ctx, val);
            val = JS_UNDEFINED;
            if (JS_IsException(acc1))
                goto exception;
            JS_FreeValue(ctx, acc);
            acc = acc1;
        }
    }
    JS_FreeValue(ctx, obj);
    return acc;

exception:
    JS_FreeValue(ctx, acc);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}